

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

int Llb_Nonlin4HasSingletonVars(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)pPart->vVars->nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if (p->pVars[pPart->vVars->pArray[lVar2]]->vParts->nSize == 1) {
        return 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return 0;
}

Assistant:

int Llb_Nonlin4HasSingletonVars( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    int i;
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( Vec_IntSize(pVar->vParts) == 1 )
            return 1;
    return 0;
}